

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::RgbaInputFile::setFrameBuffer(RgbaInputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined1 in_R10B;
  size_t yst;
  size_t xst;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [56];
  FrameBuffer fb;
  
  local_90._0_8_ = this->_fromYca;
  if ((FromYca *)local_90._0_8_ == (FromYca *)0x0) {
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __lhs = &this->_channelNamePrefix;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pbVar1 = std::operator+(&local_b0,__lhs,"R");
    xst = xStride << 3;
    yst = yStride << 3;
    Slice::Slice((Slice *)local_90,HALF,(char *)base,xst,yst,1,1,0.0,(bool)in_R10B,SUB81(pbVar1,0));
    FrameBuffer::insert(&fb,&local_b0,(Slice *)local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    pbVar1 = std::operator+(&local_b0,__lhs,"G");
    Slice::Slice((Slice *)local_90,HALF,(char *)&base->g,xst,yst,1,1,0.0,(bool)in_R10B,
                 SUB81(pbVar1,0));
    FrameBuffer::insert(&fb,&local_b0,(Slice *)local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    pbVar1 = std::operator+(&local_b0,__lhs,"B");
    Slice::Slice((Slice *)local_90,HALF,(char *)&base->b,xst,yst,1,1,0.0,(bool)in_R10B,
                 SUB81(pbVar1,0));
    FrameBuffer::insert(&fb,&local_b0,(Slice *)local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    pbVar1 = std::operator+(&local_b0,__lhs,"A");
    Slice::Slice((Slice *)local_90,HALF,(char *)&base->a,xst,yst,1,1,1.0,(bool)in_R10B,
                 SUB81(pbVar1,0));
    FrameBuffer::insert(&fb,&local_b0,(Slice *)local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    InputFile::setFrameBuffer(this->_inputFile,&fb);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&fb);
  }
  else {
    std::mutex::lock((mutex *)local_90._0_8_);
    local_90[8] = true;
    FromYca::setFrameBuffer(this->_fromYca,base,xStride,yStride,&this->_channelNamePrefix);
    IlmThread_2_5::Lock::~Lock((Lock *)local_90);
  }
  return;
}

Assistant:

void	
RgbaInputFile::setFrameBuffer (Rgba *base, size_t xStride, size_t yStride)
{
    if (_fromYca)
    {
	Lock lock (*_fromYca);
	_fromYca->setFrameBuffer (base, xStride, yStride, _channelNamePrefix);
    }
    else
    {
	size_t xs = xStride * sizeof (Rgba);
	size_t ys = yStride * sizeof (Rgba);

	FrameBuffer fb;

	fb.insert (_channelNamePrefix + "R",
		   Slice (HALF,
			  (char *) &base[0].r,
			  xs, ys,
			  1, 1,		// xSampling, ySampling
			  0.0));	// fillValue

	fb.insert (_channelNamePrefix + "G",
		   Slice (HALF,
			  (char *) &base[0].g,
			  xs, ys,
			  1, 1,		// xSampling, ySampling
			  0.0));	// fillValue

	fb.insert (_channelNamePrefix + "B",
		   Slice (HALF,
			  (char *) &base[0].b,
			  xs, ys,
			  1, 1,		// xSampling, ySampling
			  0.0));	// fillValue

	fb.insert (_channelNamePrefix + "A",
		   Slice (HALF,
			  (char *) &base[0].a,
			  xs, ys,
			  1, 1,		// xSampling, ySampling
			  1.0));	// fillValue

	_inputFile->setFrameBuffer (fb);
    }
}